

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O1

lda_reference * load_lda_reference_values(lda_reference *__return_storage_ptr__,Kernel k,Spin p)

{
  runtime_error *this;
  
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (p == Unpolarized) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
               &__return_storage_ptr__->rho);
    __return_storage_ptr__->npts =
         (int)((ulong)((long)rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
    if (k != SlaterExchange) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"No Reference Values for Specified Kernel");
LAB_0016bfca:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (exc_xc_lda_x_ref_unp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               exc_xc_lda_x_ref_unp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
               &__return_storage_ptr__->exc);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (vxc_xc_lda_x_ref_unp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               vxc_xc_lda_x_ref_unp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
               &__return_storage_ptr__->vrho);
  }
  else {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (rho_polarized.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               rho_polarized.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
               &__return_storage_ptr__->rho);
    __return_storage_ptr__->npts =
         (int)((ulong)((long)rho_polarized.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)rho_polarized.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 4);
    if (k != SlaterExchange) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"No Reference Values for Specified Kernel");
      goto LAB_0016bfca;
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (exc_xc_lda_x_ref_pol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               exc_xc_lda_x_ref_pol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
               &__return_storage_ptr__->exc);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (vxc_xc_lda_x_ref_pol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               vxc_xc_lda_x_ref_pol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
               &__return_storage_ptr__->vrho);
  }
  return __return_storage_ptr__;
}

Assistant:

lda_reference load_lda_reference_values(ExchCXX::Kernel k, ExchCXX::Spin p) {

  using namespace ExchCXX; 

  lda_reference ref_vals;

  if( p == Spin::Unpolarized ) {

    copy_iterable( rho, std::back_inserter(ref_vals.rho) );
    ref_vals.npts = rho.size();

    switch(k) {
      case Kernel::SlaterExchange:
        copy_iterable( exc_xc_lda_x_ref_unp, std::back_inserter(ref_vals.exc) );
        copy_iterable( vxc_xc_lda_x_ref_unp, std::back_inserter(ref_vals.vrho) );
        break;
      default: 
        throw std::runtime_error("No Reference Values for Specified Kernel");
    }

  } else {

    copy_iterable( rho_polarized, std::back_inserter(ref_vals.rho) );
    ref_vals.npts = rho_polarized.size() / 2;

    switch(k) {
      case Kernel::SlaterExchange:
        copy_iterable( exc_xc_lda_x_ref_pol, std::back_inserter(ref_vals.exc) );
        copy_iterable( vxc_xc_lda_x_ref_pol, std::back_inserter(ref_vals.vrho) );
        break;
      default: 
        throw std::runtime_error("No Reference Values for Specified Kernel");
    }

  }

  return ref_vals;
}